

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_label.cc
# Opt level: O0

void no_label::parse_no_label
               (parser *param_1,shared_data *param_2,void *param_3,v_array<substring> *words)

{
  substring s;
  size_t sVar1;
  ostream *this;
  ostream *poVar2;
  char *pcVar3;
  char *pcVar4;
  v_array<substring> *in_RCX;
  uint i;
  uint local_24;
  
  sVar1 = v_array<substring>::size(in_RCX);
  if (sVar1 != 0) {
    this = std::operator<<((ostream *)&std::cout,"Error: ");
    sVar1 = v_array<substring>::size(in_RCX);
    poVar2 = (ostream *)std::ostream::operator<<(this,sVar1);
    std::operator<<(poVar2," is too many tokens for a simple label: ");
    local_24 = 0;
    while( true ) {
      pcVar3 = (char *)(ulong)local_24;
      pcVar4 = (char *)v_array<substring>::size(in_RCX);
      if (pcVar4 <= pcVar3) break;
      v_array<substring>::operator[](in_RCX,(ulong)local_24);
      s.end = (char *)this;
      s.begin = pcVar3;
      print_substring(s);
      local_24 = local_24 + 1;
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void parse_no_label(parser*, shared_data*, void*, v_array<substring>& words)
{
  switch (words.size())
  {
    case 0:
      break;
    default:
      cout << "Error: " << words.size() << " is too many tokens for a simple label: ";
      for (unsigned int i = 0; i < words.size(); ++i) print_substring(words[i]);
      cout << endl;
  }
}